

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,int *active,char *str,int len,
                nk_toggle_type type,nk_style_toggle *style,nk_input *in,nk_user_font *font)

{
  float fVar1;
  nk_toggle_type nVar2;
  undefined4 uVar3;
  int iVar4;
  nk_image *img;
  uint uVar5;
  nk_style_item *pnVar6;
  uint uVar7;
  nk_flags nVar8;
  nk_style_toggle *pnVar9;
  float fVar10;
  float fVar11;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect nVar18;
  nk_rect r_03;
  nk_rect r_04;
  nk_rect rect_01;
  nk_rect r_05;
  nk_rect r_06;
  nk_rect rect_02;
  nk_rect b;
  undefined8 local_128;
  float local_118;
  float fStack_114;
  nk_text local_d0;
  nk_toggle_type local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  char *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  nk_rect r_02;
  
  nVar18.x = r.x;
  fStack_a4 = r.y;
  if (style == (nk_style_toggle *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f13,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f14,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f15,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (active == (int *)0x0) goto LAB_001353dd;
  fVar1 = font->height;
  fVar14 = style->border;
  local_88 = fVar14 + fVar14;
  fVar10 = (style->touch_padding).x;
  fVar12 = (style->touch_padding).y;
  local_78 = nVar18.x - fVar10;
  fStack_74 = fStack_a4 - fVar12;
  fStack_70 = in_XMM0_Dc - 0.0;
  fStack_6c = in_XMM0_Dd - 0.0;
  local_118 = (style->padding).x;
  fStack_114 = (style->padding).y;
  local_b8 = local_118 + local_118;
  fStack_b4 = fStack_114 + fStack_114;
  fStack_b0 = 0.0;
  fStack_ac = 0.0;
  auVar16._0_4_ = local_b8 + fVar1;
  auVar16._4_4_ = fStack_b4 + fVar1;
  auVar16._8_4_ = fVar1 + 0.0;
  auVar16._12_4_ = fVar1 + 0.0;
  auVar17._8_4_ = in_XMM1_Dc;
  auVar17._0_8_ = r._8_8_;
  auVar17._12_4_ = in_XMM1_Dd;
  auVar17 = maxps(auVar16,auVar17);
  local_68 = fVar10 + fVar10 + auVar17._0_4_;
  fStack_54 = auVar17._4_4_;
  fStack_64 = fVar12 + fVar12 + fStack_54;
  fStack_60 = auVar17._8_4_ + 0.0;
  fStack_5c = auVar17._12_4_ + 0.0;
  fVar12 = (fStack_54 * 0.5 + fStack_a4) - fVar1 * 0.5;
  local_48 = ZEXT416((uint)fVar1);
  local_a8 = nVar18.x + fVar1 + style->spacing;
  fVar15 = auVar17._0_4_ + nVar18.x;
  fVar10 = local_a8;
  if (local_a8 <= fVar15) {
    fVar10 = fVar15;
  }
  uVar5 = *active;
  *state = *state & 2 | 4;
  r_00.y = fStack_74;
  r_00.x = local_78;
  r_00.h = fStack_64;
  r_00.w = local_68;
  local_bc = type;
  local_90 = str;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  local_58 = fVar12;
  fStack_50 = fStack_54;
  fStack_4c = fStack_54;
  iVar4 = nk_button_behavior(state,r_00,in,NK_BUTTON_DEFAULT);
  if (iVar4 == 0) {
    uVar7 = *state;
    if (((uVar7 & 0x10) == 0) ||
       (rect.y = fStack_74, rect.x = local_78, rect.h = fStack_64, rect.w = local_68,
       iVar4 = nk_input_is_mouse_prev_hovering_rect(in,rect), iVar4 != 0)) goto LAB_001350a4;
    nVar8 = uVar7 | 8;
LAB_001350c9:
    *state = nVar8;
  }
  else {
    *state = 0x22;
    uVar5 = (uint)(uVar5 == 0);
    uVar7 = 0x22;
LAB_001350a4:
    rect_00.y = fStack_74;
    rect_00.x = local_78;
    rect_00.h = fStack_64;
    rect_00.w = local_68;
    iVar4 = nk_input_is_mouse_prev_hovering_rect(in,rect_00);
    if (iVar4 != 0) {
      nVar8 = uVar7 | 0x40;
      goto LAB_001350c9;
    }
  }
  nVar2 = local_bc;
  fVar10 = fVar10 - local_a8;
  *active = uVar5;
  fVar15 = local_b8 + local_88;
  fVar11 = fStack_b4 + fStack_84;
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_b8 = local_b8 + local_88;
    fStack_b4 = fStack_b4 + fStack_84;
    fStack_b0 = fStack_b0 + fStack_80;
    fStack_ac = fStack_ac + fStack_7c;
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    fVar15 = local_b8;
    fVar11 = fStack_b4;
  }
  fStack_a0 = fStack_a4;
  fVar13 = local_118 + nVar18.x + fVar14;
  fVar14 = fStack_114 + fVar12 + fVar14;
  fVar15 = fVar1 - fVar15;
  fVar11 = fVar1 - fVar11;
  fStack_a4 = local_58;
  fStack_9c = fStack_54;
  uVar3 = local_48._0_4_;
  uVar5 = *state;
  iVar4 = *active;
  if (nVar2 == NK_TOGGLE_CHECK) {
    if ((uVar5 & 0x10) == 0) {
      if ((uVar5 & 0x20) != 0) {
        local_d0.text = style->text_active;
        goto LAB_001352df;
      }
      pnVar6 = &style->cursor_normal;
      local_d0.text = style->text_normal;
      pnVar9 = style;
    }
    else {
      local_d0.text = style->text_hover;
LAB_001352df:
      pnVar9 = (nk_style_toggle *)&style->hover;
      pnVar6 = &style->cursor_hover;
    }
    if ((pnVar9->normal).type == NK_STYLE_ITEM_COLOR) {
      rect_01.y = fVar12;
      rect_01.x = nVar18.x;
      rect_01.h = fVar1;
      rect_01.w = fVar1;
      nk_fill_rect(out,rect_01,0.0,style->border_color);
      r_05.y = fVar12;
      r_05.x = nVar18.x;
      r_05.h = fVar1;
      r_05.w = fVar1;
      nVar18 = nk_shrink_rect(r_05,style->border);
      nk_fill_rect(out,nVar18,0.0,(pnVar9->normal).data.color);
    }
    else {
      r_04.y = fVar12;
      r_04.x = nVar18.x;
      r_04.h = fVar1;
      r_04.w = fVar1;
      nk_draw_image(out,r_04,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
    }
    if (iVar4 != 0) {
      img = (nk_image *)&pnVar6->data;
      if (pnVar6->type == NK_STYLE_ITEM_IMAGE) goto LAB_00135362;
      rect_02.y = fVar14;
      rect_02.x = fVar13;
      rect_02.w = fVar15;
      rect_02.h = fVar11;
      nk_fill_rect(out,rect_02,0.0,*(nk_color *)img);
    }
  }
  else {
    if ((uVar5 & 0x10) == 0) {
      if ((uVar5 & 0x20) != 0) {
        local_d0.text = style->text_active;
        goto LAB_00135233;
      }
      pnVar6 = &style->cursor_normal;
      local_d0.text = style->text_normal;
      pnVar9 = style;
    }
    else {
      local_d0.text = style->text_hover;
LAB_00135233:
      pnVar9 = (nk_style_toggle *)&style->hover;
      pnVar6 = &style->cursor_hover;
    }
    if ((pnVar9->normal).type == NK_STYLE_ITEM_COLOR) {
      r_01.y = fVar12;
      r_01.x = nVar18.x;
      r_01.h = fVar1;
      r_01.w = fVar1;
      nk_fill_circle(out,r_01,style->border_color);
      r_02.y = fVar12;
      r_02.x = nVar18.x;
      r_02.h = fVar1;
      r_02.w = fVar1;
      nVar18 = nk_shrink_rect(r_02,style->border);
      nk_fill_circle(out,nVar18,(pnVar9->normal).data.color);
    }
    else {
      nVar18.y = fVar12;
      nVar18.h = fVar1;
      nVar18.w = fVar1;
      nk_draw_image(out,nVar18,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
    }
    r_03.y = fVar14;
    r_03.x = fVar13;
    if (iVar4 != 0) {
      img = (nk_image *)&pnVar6->data;
      if (pnVar6->type == NK_STYLE_ITEM_IMAGE) {
LAB_00135362:
        r_06.y = fVar14;
        r_06.x = fVar13;
        r_06.w = fVar15;
        r_06.h = fVar11;
        nk_draw_image(out,r_06,img,(nk_color)0xffffffff);
      }
      else {
        r_03.w = fVar15;
        r_03.h = fVar11;
        nk_fill_circle(out,r_03,*(nk_color *)img);
      }
    }
  }
  local_d0.padding.x = 0.0;
  local_d0.padding.y = 0.0;
  local_d0.background = style->text_background;
  b.y = fStack_a4;
  b.x = local_a8;
  b.h = (float)uVar3;
  b.w = fVar10;
  nk_widget_text(out,b,local_90,len,&local_d0,0x11,font);
  font = (nk_user_font *)style->draw_end;
  if (font != (nk_user_font *)0x0) {
    font = (nk_user_font *)(*(code *)font)(out,(style->userdata).ptr);
  }
LAB_001353dd:
  return (int)font;
}

Assistant:

NK_LIB int
nk_do_toggle(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect r,
    int *active, const char *str, int len, enum nk_toggle_type type,
    const struct nk_style_toggle *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int was_active;
    struct nk_rect bounds;
    struct nk_rect select;
    struct nk_rect cursor;
    struct nk_rect label;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font || !active)
        return 0;

    r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
    r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

    /* add additional touch padding for touch screen devices */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;

    /* calculate the selector space */
    select.w = font->height;
    select.h = select.w;
    select.y = r.y + r.h/2.0f - select.h/2.0f;
    select.x = r.x;

    /* calculate the bounds of the cursor inside the selector */
    cursor.x = select.x + style->padding.x + style->border;
    cursor.y = select.y + style->padding.y + style->border;
    cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
    cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

    /* label behind the selector */
    label.x = select.x + select.w + style->spacing;
    label.y = select.y;
    label.w = NK_MAX(r.x + r.w, label.x) - label.x;
    label.h = select.w;

    /* update selector */
    was_active = *active;
    *active = nk_toggle_behavior(in, bounds, state, *active);

    /* draw selector */
    if (style->draw_begin)
        style->draw_begin(out, style->userdata);
    if (type == NK_TOGGLE_CHECK) {
        nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    } else {
        nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    }
    if (style->draw_end)
        style->draw_end(out, style->userdata);
    return (was_active != *active);
}